

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_accept_cb(void *arg)

{
  nng_stream *conn_00;
  nng_stream *conn;
  tlstran_pipe *ptStack_28;
  int rv;
  tlstran_pipe *p;
  nni_aio *aio;
  tlstran_ep *ep;
  void *arg_local;
  
  p = (tlstran_pipe *)((long)arg + 0x80);
  aio = (nni_aio *)arg;
  ep = (tlstran_ep *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  conn._4_4_ = nni_aio_result((nni_aio *)p);
  if (conn._4_4_ == NNG_OK) {
    conn_00 = (nng_stream *)nni_aio_get_output((nni_aio *)p,0);
    if (((ulong)(aio->a_task).task_cb & 0x100) == 0) {
      conn._4_4_ = nni_pipe_alloc_listener
                             (&stack0xffffffffffffffd8,
                              (nni_listener *)(aio->a_task).task_mtx.mtx.__data.__list.__next);
      if (conn._4_4_ == NNG_OK) {
        tlstran_pipe_start(ptStack_28,conn_00,(tlstran_ep *)aio);
        nng_stream_listener_accept
                  (*(nng_stream_listener **)((long)&(aio->a_task).task_mtx.mtx + 0x10),(nng_aio *)p)
        ;
        nni_mtx_unlock((nni_mtx *)aio);
        return;
      }
      nng_stream_free(conn_00);
    }
    else {
      nng_stream_free(conn_00);
      conn._4_4_ = NNG_ECLOSED;
    }
  }
  p = *(tlstran_pipe **)&(aio->a_task).task_cv.cv;
  if (p != (tlstran_pipe *)0x0) {
    (aio->a_task).task_cv.cv.__align = 0;
    nni_aio_finish_error((nni_aio *)p,conn._4_4_);
  }
  if (conn._4_4_ != NNG_ENOMEM) {
    if (conn._4_4_ == NNG_ECLOSED) goto LAB_00132945;
    if (conn._4_4_ != NNG_ENOFILES) {
      if ((conn._4_4_ != NNG_ESTOPPED) && (((ulong)(aio->a_task).task_cb & 0x100) == 0)) {
        nng_stream_listener_accept
                  (*(nng_stream_listener **)((long)&(aio->a_task).task_mtx.mtx + 0x10),
                   (nng_aio *)((long)&(aio->a_task).task_cv.cv + 8));
      }
      goto LAB_00132945;
    }
  }
  nng_sleep_aio(10,(nng_aio *)((long)&aio[1].a_task.task_cv.cv + 8));
LAB_00132945:
  nni_mtx_unlock((nni_mtx *)aio);
  return;
}

Assistant:

static void
tlstran_accept_cb(void *arg)
{
	tlstran_ep   *ep  = arg;
	nni_aio      *aio = &ep->connaio;
	tlstran_pipe *p;
	int           rv;
	nng_stream   *conn;

	nni_mtx_lock(&ep->mtx);

	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	rv = nni_pipe_alloc_listener((void **) &p, ep->nlistener);
	if (rv != 0) {
		nng_stream_free(conn);
		goto error;
	}
	tlstran_pipe_start(p, conn, ep);
	nng_stream_listener_accept(ep->listener, aio);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// When an error here occurs, let's send a notice up to the consumer.
	// That way it can be reported properly.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	switch (rv) {
	case NNG_ECLOSED:
	case NNG_ESTOPPED:
		break;
	case NNG_ENOMEM:
	case NNG_ENOFILES:
		// We need to cool down here, to avoid spinning.
		nng_sleep_aio(10, &ep->timeaio);
		break;

	default:
		// Start another accept. This is done because we want to
		// ensure that TLS negotiations are disconnected from
		// the upper layer accept logic.
		if (!ep->closed) {
			nng_stream_listener_accept(ep->listener, &ep->connaio);
		}
		break;
	}
	nni_mtx_unlock(&ep->mtx);
}